

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxu32 SyStrlen(char *zSrc)

{
  char *pcVar1;
  char *local_18;
  char *zIn;
  char *zSrc_local;
  
  for (local_18 = zSrc;
      (((pcVar1 = local_18, *local_18 != '\0' && (pcVar1 = local_18 + 1, local_18[1] != '\0')) &&
       (pcVar1 = local_18 + 2, local_18[2] != '\0')) && (pcVar1 = local_18 + 3, local_18[3] != '\0')
      ); local_18 = local_18 + 4) {
  }
  local_18 = pcVar1;
  return (int)local_18 - (int)zSrc;
}

Assistant:

JX9_PRIVATE sxu32 SyStrlen(const char *zSrc)
{
	register const char *zIn = zSrc;
#if defined(UNTRUST)
	if( zIn == 0 ){
		return 0;
	}
#endif
	for(;;){
		if( !zIn[0] ){ break; } zIn++;
		if( !zIn[0] ){ break; } zIn++;
		if( !zIn[0] ){ break; } zIn++;
		if( !zIn[0] ){ break; } zIn++;	
	}
	return (sxu32)(zIn - zSrc);
}